

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O0

StringPiece re2::EngineName(Engine e)

{
  ostream *poVar1;
  StringPiece SVar2;
  LogMessage local_4b0;
  LogMessage local_330;
  LogMessage local_1a0;
  Engine local_1c;
  undefined1 auStack_18 [4];
  Engine e_local;
  undefined4 local_10;
  
  local_1c = e;
  if ((int)e < 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0x2c);
    poVar1 = LogMessage::stream(&local_1a0);
    std::operator<<(poVar1,"Check failed: (e) >= (0)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  }
  if (9 < (int)local_1c) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_330,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0x2d);
    poVar1 = LogMessage::stream(&local_330);
    std::operator<<(poVar1,
                    "Check failed: (e) < ((int)(sizeof(engine_names)/sizeof((engine_names)[0])))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_330);
  }
  if (*(long *)(engine_names + (ulong)local_1c * 8) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_4b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0x2e);
    poVar1 = LogMessage::stream(&local_4b0);
    std::operator<<(poVar1,"Check failed: engine_names[e] != NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4b0);
  }
  StringPiece::StringPiece((StringPiece *)auStack_18,*(char **)(engine_names + (ulong)local_1c * 8))
  ;
  SVar2._12_4_ = 0;
  SVar2.ptr_ = (char *)_auStack_18;
  SVar2.length_ = local_10;
  return SVar2;
}

Assistant:

static StringPiece EngineName(Engine e) {
  CHECK_GE(e, 0);
  CHECK_LT(e, arraysize(engine_names));
  CHECK(engine_names[e] != NULL);
  return engine_names[e];
}